

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_ChangeTID(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  AActor *pAVar1;
  AActor *this;
  FActorIterator iterator;
  
  if (arg0 == 0) {
    if ((it != (AActor *)0x0) && (((it->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
      AActor::RemoveFromHash(it);
      it->tid = arg1;
      AActor::AddToHash(it);
    }
  }
  else {
    iterator.base = (AActor *)0x0;
    iterator.id = arg0;
    pAVar1 = FActorIterator::Next(&iterator);
    while (this = pAVar1, this != (AActor *)0x0) {
      pAVar1 = FActorIterator::Next(&iterator);
      if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        AActor::RemoveFromHash(this);
        this->tid = arg1;
        AActor::AddToHash(this);
      }
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_ChangeTID)
// Thing_ChangeTID (oldtid, newtid)
{
	if (arg0 == 0)
	{
		if (it != NULL && !(it->ObjectFlags & OF_EuthanizeMe))
		{
			it->RemoveFromHash ();
			it->tid = arg1;
			it->AddToHash ();
		}
	}
	else
	{
		FActorIterator iterator (arg0);
		AActor *actor, *next;

		next = iterator.Next ();
		while (next != NULL)
		{
			actor = next;
			next = iterator.Next ();

			if (!(actor->ObjectFlags & OF_EuthanizeMe))
			{
				actor->RemoveFromHash ();
				actor->tid = arg1;
				actor->AddToHash ();
			}
		}
	}
	return true;
}